

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeExternalMSProjectCommand.h
# Opt level: O0

cmCommand * __thiscall
cmIncludeExternalMSProjectCommand::Clone(cmIncludeExternalMSProjectCommand *this)

{
  cmCommand *this_00;
  cmIncludeExternalMSProjectCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmIncludeExternalMSProjectCommand((cmIncludeExternalMSProjectCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmIncludeExternalMSProjectCommand; }